

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O3

err_t cmdFileStamp(octet *stamp,char *name,bool_t suffix)

{
  octet *der;
  void *state;
  bool_t bVar1;
  size_t sVar2;
  blob_t buf;
  file_t file;
  size_t sVar3;
  err_t eVar4;
  octet *hash;
  ulong uVar5;
  bool bVar6;
  
  sVar2 = bashHash_keep();
  buf = blobCreate(sVar2 + 0x1014);
  if (buf == (blob_t)0x0) {
    return 0x6e;
  }
  file = fileOpen(name,"rb");
  if (file == (file_t)0x0) {
    eVar4 = 0xcb;
    goto LAB_001083a0;
  }
  sVar2 = fileSize(file);
  if (sVar2 == 0xffffffffffffffff) {
LAB_00108392:
    fileClose(file);
    eVar4 = 0xcf;
  }
  else {
    der = (octet *)((long)buf + 0x100a);
    if (sVar2 < 10 || suffix == 0) {
      bVar6 = false;
    }
    else {
      bVar1 = fileSeek(file,sVar2 - 10,0);
      if (((bVar1 == 0) || (sVar3 = fileRead2(der,10,file), sVar3 != 10)) ||
         (bVar1 = fileSeek(file,0,0), bVar1 == 0)) goto LAB_00108392;
      memRev(der,10);
      sVar3 = derTOCTDec2((octet *)0x0,der,10,4,8);
      bVar6 = sVar3 == 10;
      memRev(der,10);
    }
    if ((stamp != (octet *)0x0) || (bVar6)) {
      state = (void *)((long)buf + 0x1014);
      uVar5 = sVar2 - 10;
      if (!bVar6) {
        uVar5 = sVar2;
      }
      bashHashStart(state,0x20);
      for (; uVar5 != 0; uVar5 = uVar5 - sVar2) {
        sVar2 = 0x1000;
        if (uVar5 < 0x1000) {
          sVar2 = uVar5;
        }
        sVar3 = fileRead2(buf,sVar2,file);
        if (sVar3 != sVar2) goto LAB_00108392;
        bashHashStepH(buf,sVar2,state);
      }
      bVar1 = fileClose(file);
      if (bVar1 == 0) {
        eVar4 = 0x67;
      }
      else {
        hash = (octet *)((long)buf + 0x1000);
        bashHashStepG(hash,8,state);
        derEnc(hash,4,hash,8);
        memRev(hash,10);
        if ((bool)(bVar6 & suffix != 0)) {
          bVar1 = memEq(hash,der,10);
          eVar4 = 0xd2;
          if (bVar1 != 0) {
            eVar4 = 0;
          }
        }
        else {
          eVar4 = -(uint)(suffix != 0);
        }
        if (stamp != (octet *)0x0) {
          memCopy(stamp,hash,10);
        }
      }
    }
    else {
      fileClose(file);
      eVar4 = 0xffffffff;
    }
  }
LAB_001083a0:
  blobClose(buf);
  return eVar4;
}

Assistant:

static err_t cmdFileStamp(
	octet* stamp,			/*!< [out] штамп */
	const char* name,		/*!< [in] имя файла */
	bool_t suffix			/*!< [in] анализировать суффикс */
)
{
	const size_t buf_size = 4096;
	err_t code;
	octet* stack;
	octet* buf;			/* [buf_size] */
	octet* stamp1;		/* [10] */
	octet* stamp2;		/* [10] */
	octet* state;		/* [bashHash_keep()] */
	file_t file;
	size_t count;
	bool_t stamped;
	// pre
	ASSERT((suffix == TRUE && stamp == 0) || memIsValid(stamp, 10));
	ASSERT(strIsValid(name));
	// выделить и разметить память
	code = cmdBlobCreate(stack, buf_size + 20 + bashHash_keep());
	ERR_CALL_CHECK(code);
	buf = stack;
	stamp1 = buf + buf_size;
	stamp2 = stamp1 + 10;
	state = stamp2 + 10;
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить размер файла
	if ((count = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// штамп в суффиксе?
	stamped = FALSE;
	if (suffix && count >= 10)
	{
		if (!fileSeek(file, count - 10, SEEK_SET) ||
			fileRead2(stamp2, 10, file) != 10 ||
			!fileSeek(file, 0, SEEK_SET))
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		memRev(stamp2, 10);
		stamped = (derOCTDec2(0, stamp2, 10, 8) == 10);
		memRev(stamp2, 10);
	}
	if (stamp == 0 && !stamped)
		code = ERR_MAX;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// определить объем хэшируемой части файла
	count = stamped ? count - 10 : count;
	// хэшировать файл
	bashHashStart(state, 32);
	while (count)
	{
		size_t c = MIN2(count, buf_size);
		if (fileRead2(buf, c, file) != c)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		bashHashStepH(buf, c, state);
		count -= c;
	}
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// завершить хэширование и кодировать
	bashHashStepG(stamp1, 8, state);
	VERIFY(derOCTEnc(stamp1, stamp1, 8) == 10);
	memRev(stamp1, 10);
	// проверить суффикс
	if (suffix)
	{
		if (stamped)
			code = memEq(stamp1, stamp2, 10) ? ERR_OK : ERR_FILE_STAMP;
		else
			code = ERR_MAX;
	}
	// возвратить штамп
	if (stamp)
		memCopy(stamp, stamp1, 10);
	// завершить
	cmdBlobClose(stack);
	return code;
}